

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O1

void OpenMD::Utils::details::lifted_deleter<OpenMD::ConstraintElem*>(ConstraintElem *val)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  if (val != (ConstraintElem *)0x0) {
    p_Var1 = (val->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    p_Var1 = (val->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    operator_delete(val,0x28);
    return;
  }
  return;
}

Assistant:

void lifted_deleter(T val) {
      delete val;
    }